

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O0

SharedLocalization __thiscall ary::PlaneTracker::update(PlaneTracker *this,Mat *image)

{
  int id;
  undefined4 uVar1;
  undefined4 uVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  CameraModel *pCVar7;
  ulong uVar8;
  reference pvVar9;
  PlanarLocalization *this_00;
  pointer in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  SharedLocalization SVar11;
  Matx<float,_3,_1> MVar12;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_408;
  Size2f local_3f0;
  Ptr<ary::PlanarLocalization> local_3e8;
  float local_3d8 [2];
  float local_3d0;
  float local_3c8 [2];
  float local_3c0;
  undefined8 local_3b8;
  float local_3b0;
  undefined8 local_3a8;
  float local_3a0;
  undefined1 auStack_398 [8];
  CameraPosition updated_camera;
  _OutputArray local_378;
  int local_360;
  undefined4 local_35c;
  int i_1;
  _OutputArray local_340;
  _OutputArray local_328;
  undefined1 local_310 [112];
  _InputArray local_2a0;
  undefined1 local_288 [56];
  _InputArray local_250;
  _InputArray local_238;
  _InputArray local_220;
  allocator<int> local_201;
  undefined1 local_200 [8];
  vector<int,_std::allocator<int>_> inliers;
  Mat transVec;
  Mat rotVec;
  undefined1 local_120 [4];
  int i;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> image_points;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> object_points;
  undefined8 uStack_e8;
  Size_<int> local_e0;
  _OutputArray local_d8;
  _OutputArray local_c0;
  _InputOutputArray local_a8;
  _InputArray local_90;
  _InputArray local_78;
  _InputArray local_50;
  undefined1 local_38 [8];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> updates;
  Mat *image_local;
  PlaneTracker *this_local;
  
  *(int *)&image[4].u = *(int *)&image[4].u + 1;
  updates.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_RDX;
  sVar3 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::size
                    ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                     &image->allocator);
  if (sVar3 < 10) {
    cv::Ptr<ary::Localization>::Ptr((Ptr<ary::Localization> *)this);
    _Var10._M_pi = extraout_RDX;
  }
  else {
    std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
              ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_38);
    cv::_InputArray::_InputArray(&local_50,(Mat *)&image->step);
    cv::_InputArray::_InputArray
              (&local_78,
               (Mat *)updates.
                      super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
    cv::_InputArray::_InputArray<cv::Point_<float>>
              (&local_90,
               (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)&image->allocator);
    cv::_InputOutputArray::_InputOutputArray<cv::Point_<float>>
              (&local_a8,(vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_38)
    ;
    cv::_OutputArray::_OutputArray<unsigned_char>
              (&local_c0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&image[2].step);
    cv::_OutputArray::_OutputArray(&local_d8,image + 3);
    cv::Size_<int>::Size_(&local_e0,0x15,0x15);
    cv::TermCriteria::TermCriteria
              ((TermCriteria *)
               &object_points.
                super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,3,0x1e,0.01);
    cv::calcOpticalFlowPyrLK
              (0xeb1c432d,&local_50,&local_78,&local_90,&local_a8,&local_c0,&local_d8,&local_e0,3,
               object_points.
               super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,uStack_e8,0);
    cv::_OutputArray::~_OutputArray(&local_d8);
    cv::_OutputArray::~_OutputArray(&local_c0);
    cv::_InputOutputArray::~_InputOutputArray(&local_a8);
    cv::_InputArray::~_InputArray(&local_90);
    cv::_InputArray::~_InputArray(&local_78);
    cv::_InputArray::~_InputArray(&local_50);
    std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::vector
              ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
               &image_points.
                super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
              ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_120);
    rotVec.step.buf[1]._4_4_ = 0;
    while( true ) {
      sVar3 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::size
                        ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                         &image->allocator);
      if (sVar3 <= (ulong)(long)rotVec.step.buf[1]._4_4_) break;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&image[2].step,
                          (long)rotVec.step.buf[1]._4_4_);
      if (*pvVar4 != '\0') {
        pvVar5 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                           ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                            &image->datastart,(long)rotVec.step.buf[1]._4_4_);
        std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::push_back
                  ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                   &image_points.
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,pvVar5);
        pvVar6 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                           ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                            local_38,(long)rotVec.step.buf[1]._4_4_);
        std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
                  ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_120,
                   pvVar6);
      }
      rotVec.step.buf[1]._4_4_ = rotVec.step.buf[1]._4_4_ + 1;
    }
    cv::Mat::Mat((Mat *)(transVec.step.buf + 1));
    cv::Mat::Mat((Mat *)&inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    sVar3 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::size
                      ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_120);
    std::allocator<int>::allocator(&local_201);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_200,sVar3,&local_201);
    std::allocator<int>::~allocator(&local_201);
    cv::_InputArray::_InputArray<cv::Point3_<float>>
              (&local_220,
               (vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
               &image_points.
                super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    cv::_InputArray::_InputArray<cv::Point_<float>>
              (&local_238,
               (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_120);
    CameraUser::getCameraModel((CameraUser *)local_288);
    pCVar7 = cv::Ptr<ary::CameraModel>::operator->((Ptr<ary::CameraModel> *)local_288);
    CameraModel::getIntrinsics((Matx33f *)(local_288 + 0x14),pCVar7);
    cv::_InputArray::_InputArray<float,3,3>(&local_250,(Matx<float,_3,_3> *)(local_288 + 0x14));
    CameraUser::getCameraModel((CameraUser *)local_310);
    pCVar7 = cv::Ptr<ary::CameraModel>::operator->((Ptr<ary::CameraModel> *)local_310);
    CameraModel::getDistortion((Mat *)(local_310 + 0x10),pCVar7);
    cv::_InputArray::_InputArray(&local_2a0,(Mat *)(local_310 + 0x10));
    cv::_OutputArray::_OutputArray(&local_328,(Mat *)(transVec.step.buf + 1));
    cv::_OutputArray::_OutputArray
              (&local_340,
               (Mat *)&inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    cv::_OutputArray::_OutputArray<int>
              ((_OutputArray *)&i_1,(vector<int,_std::allocator<int>_> *)local_200);
    cv::solvePnPRansac(&local_220,&local_238,&local_250,&local_2a0,&local_328,&local_340,false,0x96,
                       1.0,0.9900000095367432,(_OutputArray *)&i_1,0);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&i_1);
    cv::_OutputArray::~_OutputArray(&local_340);
    cv::_OutputArray::~_OutputArray(&local_328);
    cv::_InputArray::~_InputArray(&local_2a0);
    cv::Mat::~Mat((Mat *)(local_310 + 0x10));
    cv::Ptr<ary::CameraModel>::~Ptr((Ptr<ary::CameraModel> *)local_310);
    cv::_InputArray::~_InputArray(&local_250);
    cv::Ptr<ary::CameraModel>::~Ptr((Ptr<ary::CameraModel> *)local_288);
    cv::_InputArray::~_InputArray(&local_238);
    cv::_InputArray::~_InputArray(&local_220);
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_200);
    if (sVar3 < 10) {
      cv::Ptr<ary::Localization>::Ptr((Ptr<ary::Localization> *)this);
    }
    else {
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::clear
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)&image->allocator
                );
      std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::clear
                ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                 &image->datastart);
      local_360 = 0;
      while( true ) {
        uVar8 = (ulong)local_360;
        sVar3 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)local_200);
        if (sVar3 <= uVar8) break;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_200,(long)local_360);
        pvVar6 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                           ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                            local_120,(long)*pvVar9);
        std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
                  ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                   &image->allocator,pvVar6);
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_200,(long)local_360);
        pvVar5 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                           ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                            &image_points.
                             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)*pvVar9);
        std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::push_back
                  ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                   &image->datastart,pvVar5);
        local_360 = local_360 + 1;
      }
      cv::_OutputArray::_OutputArray(&local_378,(Mat *)&image->step);
      cv::Mat::copyTo((_OutputArray *)
                      updates.
                      super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      cv::_OutputArray::~_OutputArray(&local_378);
      updated_camera.rotation.val[2] = SUB84(image[4].data,0);
      updated_camera.translation.val[0] = (float)((ulong)image[4].data >> 0x20);
      auStack_398._0_4_ = (float)image[4].flags;
      auStack_398._4_4_ = (float)image[4].dims;
      uVar1 = image[4].rows;
      uVar2 = image[4].cols;
      updated_camera.rotation.val[0] = (float)uVar1;
      updated_camera.rotation.val[1] = (float)uVar2;
      MVar12 = cv::Mat::operator_cast_to_Matx
                         ((Mat *)&inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage);
      local_3b0 = MVar12.val[2];
      local_3b8 = MVar12.val._0_8_;
      updated_camera.rotation.val[1] = MVar12.val[0];
      updated_camera.rotation.val[2] = MVar12.val[1];
      local_3a8 = local_3b8;
      local_3a0 = local_3b0;
      updated_camera.translation.val[0] = local_3b0;
      MVar12 = cv::Mat::operator_cast_to_Matx((Mat *)(transVec.step.buf + 1));
      local_3d0 = MVar12.val[2];
      local_3d8 = MVar12.val._0_8_;
      local_3c8 = local_3d8;
      local_3c0 = local_3d0;
      auStack_398 = (undefined1  [8])local_3d8;
      updated_camera.rotation.val[0] = local_3d0;
      this_00 = (PlanarLocalization *)operator_new(0x48);
      id = *(int *)((long)&image[4].u + 4);
      cv::Size_::operator_cast_to_Size_((Size_ *)&local_3f0);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                (&local_408,
                 (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                 &image[4].datastart);
      PlanarLocalization::PlanarLocalization
                (this_00,id,(CameraPosition *)auStack_398,&local_3f0,&local_408,1.0);
      cv::Ptr<ary::PlanarLocalization>::Ptr<ary::PlanarLocalization>(&local_3e8,this_00);
      cv::Ptr<ary::Localization>::Ptr<ary::PlanarLocalization>
                ((Ptr<ary::Localization> *)this,&local_3e8);
      cv::Ptr<ary::PlanarLocalization>::~Ptr(&local_3e8);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector(&local_408);
    }
    local_35c = 1;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_200);
    cv::Mat::~Mat((Mat *)&inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    cv::Mat::~Mat((Mat *)(transVec.step.buf + 1));
    std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
              ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_120);
    std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::~vector
              ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
               &image_points.
                super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
              ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_38);
    _Var10._M_pi = extraout_RDX_00;
  }
  SVar11.super_shared_ptr<ary::Localization>.
  super___shared_ptr<ary::Localization,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var10._M_pi
  ;
  SVar11.super_shared_ptr<ary::Localization>.
  super___shared_ptr<ary::Localization,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SharedLocalization)
         SVar11.super_shared_ptr<ary::Localization>.
         super___shared_ptr<ary::Localization,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedLocalization PlaneTracker::update(const Mat& image) {

    age++;

	if (keypoints_current.size() < 10)
		return Ptr<Localization>();

	vector<Point2f> updates;
	calcOpticalFlowPyrLK(previous, image, keypoints_current, updates, status, errors);

	vector<Point3f> object_points;
	vector<Point2f> image_points;

	for (int i = 0; i < keypoints_current.size(); i++) {
		if (status[i]) {
			object_points.push_back(keypoints_start[i]);
			image_points.push_back(updates[i]);
		}
	}

	Mat rotVec;
	Mat transVec;

	vector<int> inliers(image_points.size());

	solvePnPRansac(object_points, image_points, getCameraModel()->getIntrinsics(), getCameraModel()->getDistortion(), rotVec, transVec, false, 150, 1, 0.99f, inliers);


	if (inliers.size() < 10)
		return Ptr<Localization>();

	keypoints_current.clear();
	keypoints_start.clear();
	for (int i = 0; i < inliers.size(); i++) {
		keypoints_current.push_back(image_points[inliers[i]]);
		keypoints_start.push_back(object_points[inliers[i]]);
	}

	image.copyTo(previous);

	CameraPosition updated_camera = camera;

	updated_camera.translation = Matx31f(transVec);
	updated_camera.rotation = Matx31f(rotVec);

/*
	vector<Point2f> image_points2;
	projectPoints(keypoints_start, updated_camera.rotation, updated_camera.translation, getCameraModel()->getIntrinsics(), getCameraModel()->getDistortion(), image_points2);

	Mat test;
	image.copyTo(test);

	for (int i = 0; i < keypoints_start.size(); i++) {
		line(test, image_points2[i], keypoints_current[i], Scalar(255), 2);
	//cout <<  keypoints_current[i] << image_points2[i] << keypoints_start[i] << endl;

	}

	imshow("Test", test);
	//waitKey(0);
*/

	return Ptr<PlanarLocalization>(new PlanarLocalization(identifier, updated_camera, plane_size, plane_corners));
}